

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_validate_value(lys_node *node,char *value)

{
  char *value_00;
  lys_type *plVar1;
  lys_node *plVar2;
  uint uVar3;
  lyd_node_leaf_list local_68;
  
  if ((node == (lys_node *)0x0) || ((node->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_validate_value");
    uVar3 = 1;
  }
  else {
    value_00 = "";
    if (value != (char *)0x0) {
      value_00 = value;
    }
    local_68.value.binary = (char *)0x0;
    local_68.value_type = LY_TYPE_DER;
    local_68.value_flags = '\0';
    local_68._77_3_ = 0;
    local_68.hash = 0;
    local_68._52_4_ = 0;
    local_68.value_str = (char *)0x0;
    local_68.prev = (lyd_node *)0x0;
    local_68.parent = (lyd_node *)0x0;
    local_68.attr = (lyd_attr *)0x0;
    local_68.next = (lyd_node *)0x0;
    local_68.schema = (lys_node *)0x0;
    local_68.validity = '\0';
    local_68._9_7_ = 0;
    local_68.value_str = lydict_insert(node->module->ctx,value_00,0);
    plVar2 = node;
    do {
      local_68.schema = node;
      if (*(LY_DATA_TYPE *)&plVar2[1].ref != LY_TYPE_LEAFREF) {
        local_68.value_type = *(LY_DATA_TYPE *)&plVar2[1].ref;
        plVar1 = lyp_parse_value((lys_type *)&plVar2[1].ref,&local_68.value_str,(lyxml_elem *)0x0,
                                 &local_68,(lyd_attr *)0x0,(lys_module *)0x0,0,0,0);
        uVar3 = (uint)(plVar1 == (lys_type *)0x0);
        goto LAB_0016df65;
      }
      plVar2 = *(lys_node **)&plVar2[1].nodetype;
    } while (plVar2 != (lys_node *)0x0);
    local_68.value_type = LY_TYPE_LEAFREF;
    ly_log(node->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
           ,0x14b3);
    uVar3 = 1;
LAB_0016df65:
    lydict_remove(node->module->ctx,local_68.value_str);
  }
  return uVar3;
}

Assistant:

API int
lyd_validate_value(struct lys_node *node, const char *value)
{
    struct lyd_node_leaf_list leaf;
    struct lys_node_leaf *sleaf = (struct lys_node_leaf*)node;
    int ret = EXIT_SUCCESS;

    if (!node || !(node->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (!value) {
        value = "";
    }

    /* dummy leaf */
    memset(&leaf, 0, sizeof leaf);
    leaf.value_str = lydict_insert(node->module->ctx, value, 0);

repeat:
    leaf.value_type = sleaf->type.base;
    leaf.schema = node;

    if (leaf.value_type == LY_TYPE_LEAFREF) {
        if (!sleaf->type.info.lref.target) {
            /* it should either be unresolved leafref (leaf.value_type are ORed flags) or it will be resolved */
            LOGINT(node->module->ctx);
            ret = EXIT_FAILURE;
            goto cleanup;
        }
        sleaf = sleaf->type.info.lref.target;
        goto repeat;
    } else {
        if (!lyp_parse_value(&sleaf->type, &leaf.value_str, NULL, &leaf, NULL, NULL, 0, 0, 0)) {
            ret = EXIT_FAILURE;
            goto cleanup;
        }
    }

cleanup:
    lydict_remove(node->module->ctx, leaf.value_str);
    return ret;
}